

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

SQNativeClosure * __thiscall SQNativeClosure::Clone(SQNativeClosure *this)

{
  SQNativeClosure *pSVar1;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  long local_20;
  SQInteger _n_;
  SQNativeClosure *ret;
  SQNativeClosure *this_local;
  
  pSVar1 = Create((this->super_SQCollectable)._sharedstate,this->_function,this->_noutervalues);
  pSVar1->_env = this->_env;
  if (pSVar1->_env != (SQWeakRef *)0x0) {
    (pSVar1->_env->super_SQRefCounted)._uiRef = (pSVar1->_env->super_SQRefCounted)._uiRef + 1;
  }
  ::SQObjectPtr::operator=(&pSVar1->_name,&this->_name);
  src = extraout_RDX;
  for (local_20 = 0; local_20 < (long)this->_noutervalues; local_20 = local_20 + 1) {
    ::SQObjectPtr::operator=(pSVar1->_outervalues + local_20,this->_outervalues + local_20);
    src = extraout_RDX_00;
  }
  sqvector<long_long>::copy(&pSVar1->_typecheck,(EVP_PKEY_CTX *)&this->_typecheck,src);
  pSVar1->_nparamscheck = this->_nparamscheck;
  return pSVar1;
}

Assistant:

SQNativeClosure *Clone()
    {
        SQNativeClosure * ret = SQNativeClosure::Create(_opt_ss(this),_function,_noutervalues);
        ret->_env = _env;
        if(ret->_env) __ObjAddRef(ret->_env);
        ret->_name = _name;
        _COPY_VECTOR(ret->_outervalues,_outervalues,_noutervalues);
        ret->_typecheck.copy(_typecheck);
        ret->_nparamscheck = _nparamscheck;
        return ret;
    }